

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InlinePass::IsInlinableFunctionCall(InlinePass *this,Instruction *inst)

{
  iterator iVar1;
  mapped_type *ppFVar2;
  uint32_t calleeFnId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string message;
  
  if (inst->opcode_ == OpFunctionCall) {
    calleeFnId = Instruction::GetSingleWordOperand(inst,2);
    iVar1 = std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::find(&(this->inlinable_)._M_t,&calleeFnId);
    if ((_Rb_tree_header *)iVar1._M_node != &(this->inlinable_)._M_t._M_impl.super__Rb_tree_header)
    {
      iVar1 = std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::find(&(this->early_return_funcs_)._M_t,&calleeFnId);
      if ((_Rb_tree_header *)iVar1._M_node !=
          &(this->early_return_funcs_)._M_t._M_impl.super__Rb_tree_header) {
        ppFVar2 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->id2function_,&calleeFnId);
        Instruction::PrettyPrint_abi_cxx11_
                  (&local_68,
                   ((*ppFVar2)->def_inst_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,0);
        std::operator+(&local_88,"The function \'",&local_68);
        std::operator+(&message,&local_88,
                       "\' could not be inlined because the return instruction is not at the end of the function. This could be fixed by running merge-return before inlining."
                      );
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_88._M_string_length = 0;
        local_88.field_2._M_allocated_capacity = 0;
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(&(this->super_Pass).consumer_,SPV_MSG_WARNING,"",(spv_position_t *)&local_88,
                   message._M_dataplus._M_p);
        std::__cxx11::string::_M_dispose();
        return false;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool InlinePass::IsInlinableFunctionCall(const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpFunctionCall) return false;
  const uint32_t calleeFnId =
      inst->GetSingleWordOperand(kSpvFunctionCallFunctionId);
  const auto ci = inlinable_.find(calleeFnId);
  if (ci == inlinable_.cend()) return false;

  if (early_return_funcs_.find(calleeFnId) != early_return_funcs_.end()) {
    // We rely on the merge-return pass to handle the early return case
    // in advance.
    std::string message =
        "The function '" + id2function_[calleeFnId]->DefInst().PrettyPrint() +
        "' could not be inlined because the return instruction "
        "is not at the end of the function. This could be fixed by "
        "running merge-return before inlining.";
    consumer()(SPV_MSG_WARNING, "", {0, 0, 0}, message.c_str());
    return false;
  }

  return true;
}